

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O0

void __thiscall
CommitmentTypeIndication::Encode
          (CommitmentTypeIndication *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  size_t sVar1;
  uchar *puVar2;
  size_t *psVar3;
  undefined1 local_48 [8];
  EncodeHelper eh;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *pOut_local;
  CommitmentTypeIndication *this_local;
  
  eh.cbUsed = cbUsed;
  EncodeHelper::EncodeHelper((EncodeHelper *)local_48,cbUsed);
  sVar1 = DerBase::EncodedSize(&this->super_DerBase);
  EncodeHelper::Init((EncodeHelper *)local_48,sVar1,pOut,cbOut,'0',(this->super_DerBase).cbData);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar3 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  ObjectIdentifier::Encode(&this->commitmentTypeId,puVar2,sVar1,psVar3);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar3 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  EncodeSetOrSequenceOf<CommitmentTypeQualifier>
            (ConstructedSet,&this->commitmentTypeQualifier,puVar2,sVar1,psVar3);
  EncodeHelper::Finalize((EncodeHelper *)local_48);
  EncodeHelper::~EncodeHelper((EncodeHelper *)local_48);
  return;
}

Assistant:

void CommitmentTypeIndication::Encode(unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
    EncodeHelper eh(cbUsed);

    eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);

    commitmentTypeId.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Update();

    EncodeSetOrSequenceOf(DerType::ConstructedSet, commitmentTypeQualifier, eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Finalize();
}